

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

void __thiscall
Js::TypedArrayBase::SetObjectNoDetachCheck
          (TypedArrayBase *this,RecyclableObject *source,uint32 targetLength,uint32 offset)

{
  undefined8 uVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32 uVar5;
  int iVar6;
  undefined4 *puVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 local_40;
  Var itemValue;
  
  itemValue = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = GetSourceLength(this,source,targetLength,offset);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x3a1,"(!this->IsDetachedBuffer())","!this->IsDetachedBuffer()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  if (uVar5 != 0) {
    uVar1 = *(undefined8 *)(*(long *)((long)itemValue + 8) + 0x430);
    uVar9 = 0;
    do {
      iVar6 = (*(source->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x26])(source,source,uVar9,&local_40,itemValue);
      uVar3 = uVar1;
      if (iVar6 == 1) {
        uVar3 = local_40;
      }
      local_40 = uVar3;
      (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject
        .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                (this,(ulong)(offset + (int)uVar9),local_40);
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar5 != uVar8);
  }
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != false) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  return;
}

Assistant:

void TypedArrayBase::SetObjectNoDetachCheck(RecyclableObject* source, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = GetSourceLength(source, targetLength, offset);
        Assert(!this->IsDetachedBuffer());

        Var itemValue;
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        for (uint32 i = 0; i < sourceLength; i++)
        {
            if (!source->GetItem(source, i, &itemValue, scriptContext))
            {
                itemValue = undefinedValue;
            }
            DirectSetItemNoDetachCheck(offset + i, itemValue);
        }

        if (this->IsDetachedBuffer())
        {
            // We cannot be detached when we are creating the typed array itself. Terminate if that happens.
            Throw::FatalInternalError();
        }
    }